

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ConstructBloomFilter(WhereInfo *pWInfo,int iLevel,WhereLevel *pLevel,Bitmask notReady)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  int p1;
  Parse *pParse;
  Vdbe *p;
  SrcList *pSrcList;
  Index *pIdx;
  IndexedExpr *pIVar4;
  IndexedExpr *pIVar5;
  int addr;
  int x;
  int iVar6;
  ulong uVar7;
  int iVar8;
  WhereTerm *pWVar9;
  ulong uVar10;
  uint iIdxCol;
  WhereTerm *pWVar11;
  WhereLoop *local_80;
  
  uVar10 = (ulong)(uint)iLevel;
  pParse = pWInfo->pParse;
  p = pParse->pVdbe;
  local_80 = pLevel->pWLoop;
  pIVar4 = pParse->pIdxEpr;
  pIVar5 = pParse->pIdxPartExpr;
  pParse->pIdxEpr = (IndexedExpr *)0x0;
  pParse->pIdxPartExpr = (IndexedExpr *)0x0;
  addr = sqlite3VdbeAddOp0(p,0xf);
  while( true ) {
    sqlite3WhereExplainBloomFilter(pParse,pWInfo,pLevel);
    x = pParse->nLabel + -1;
    pParse->nLabel = x;
    p1 = pLevel->iTabCur;
    iVar8 = pParse->nMem + 1;
    pParse->nMem = iVar8;
    pLevel->regFilter = iVar8;
    pSrcList = pWInfo->pTabList;
    bVar2 = pLevel->iFrom;
    uVar7 = sqlite3LogEstToInt((pSrcList->a[bVar2].pSTab)->nRowLogEst);
    if (9999999 < uVar7) {
      uVar7 = 10000000;
    }
    if (uVar7 < 0x2711) {
      uVar7 = 10000;
    }
    sqlite3VdbeAddOp2(p,0x4d,(int)uVar7,iVar8);
    iVar8 = sqlite3VdbeAddOp1(p,0x24,p1);
    pWVar11 = (pWInfo->sWC).a;
    pWVar9 = pWVar11 + (pWInfo->sWC).nTerm;
    for (; pWVar11 < pWVar9; pWVar11 = pWVar11 + 1) {
      if ((pWVar11->wtFlags & 2) == 0) {
        iVar6 = sqlite3ExprIsSingleTableConstraint(pWVar11->pExpr,pSrcList,(uint)bVar2,0);
        if (iVar6 != 0) {
          sqlite3ExprIfFalse(pParse,pWVar11->pExpr,x,0x10);
        }
      }
    }
    if ((local_80->wsFlags & 0x100) == 0) {
      pIdx = (local_80->u).btree.pIndex;
      uVar3 = (local_80->u).btree.nEq;
      iVar6 = sqlite3GetTempRange(pParse,(uint)uVar3);
      for (iIdxCol = 0; uVar3 != iIdxCol; iIdxCol = iIdxCol + 1) {
        sqlite3ExprCodeLoadIndexColumn(pParse,pIdx,p1,iIdxCol,iVar6 + iIdxCol);
      }
      sqlite3VdbeAddOp4Int(p,0xb7,pLevel->regFilter,0,iVar6,(uint)uVar3);
      sqlite3ReleaseTempRange(pParse,iVar6,(uint)uVar3);
    }
    else {
      iVar6 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(p,0x87,p1,iVar6);
      sqlite3VdbeAddOp4Int(p,0xb7,pLevel->regFilter,0,iVar6,1);
      if (iVar6 != 0) {
        bVar2 = pParse->nTempReg;
        if ((ulong)bVar2 < 8) {
          pParse->nTempReg = bVar2 + 1;
          pParse->aTempReg[bVar2] = iVar6;
        }
      }
    }
    sqlite3VdbeResolveLabel(p,x);
    sqlite3VdbeAddOp2(p,0x27,pLevel->iTabCur,iVar8 + 1);
    sqlite3VdbeJumpHere(p,iVar8);
    pbVar1 = (byte *)((long)&local_80->wsFlags + 2);
    *pbVar1 = *pbVar1 & 0xbf;
    if ((pParse->db->dbOptFlags & 0x100000) != 0) break;
    uVar10 = (ulong)(int)uVar10;
    pLevel = (WhereLevel *)(pWInfo[1].aiCurOnePass + uVar10 * 0x1c + -10);
    while( true ) {
      uVar10 = uVar10 + 1;
      if ((long)(ulong)pWInfo->nLevel <= (long)uVar10) goto LAB_0018814c;
      if (((((pWInfo->pTabList->a[pLevel->iFrom].fg.jointype & 0x48) == 0) &&
           (local_80 = pLevel->pWLoop, local_80 != (WhereLoop *)0x0)) &&
          ((local_80->prereq & notReady) == 0)) && ((local_80->wsFlags & 0x400004) == 0x400000))
      break;
      pLevel = pLevel + 1;
    }
    if ((long)(ulong)pWInfo->nLevel <= (long)uVar10) break;
  }
LAB_0018814c:
  sqlite3VdbeJumpHere(p,addr);
  pParse->pIdxEpr = pIVar4;
  pParse->pIdxPartExpr = pIVar5;
  return;
}

Assistant:

static SQLITE_NOINLINE void sqlite3ConstructBloomFilter(
  WhereInfo *pWInfo,    /* The WHERE clause */
  int iLevel,           /* Index in pWInfo->a[] that is pLevel */
  WhereLevel *pLevel,   /* Make a Bloom filter for this FROM term */
  Bitmask notReady      /* Loops that are not ready */
){
  int addrOnce;                        /* Address of opening OP_Once */
  int addrTop;                         /* Address of OP_Rewind */
  int addrCont;                        /* Jump here to skip a row */
  const WhereTerm *pTerm;              /* For looping over WHERE clause terms */
  const WhereTerm *pWCEnd;             /* Last WHERE clause term */
  Parse *pParse = pWInfo->pParse;      /* Parsing context */
  Vdbe *v = pParse->pVdbe;             /* VDBE under construction */
  WhereLoop *pLoop = pLevel->pWLoop;   /* The loop being coded */
  int iCur;                            /* Cursor for table getting the filter */
  IndexedExpr *saved_pIdxEpr;          /* saved copy of Parse.pIdxEpr */
  IndexedExpr *saved_pIdxPartExpr;     /* saved copy of Parse.pIdxPartExpr */

  saved_pIdxEpr = pParse->pIdxEpr;
  saved_pIdxPartExpr = pParse->pIdxPartExpr;
  pParse->pIdxEpr = 0;
  pParse->pIdxPartExpr = 0;

  assert( pLoop!=0 );
  assert( v!=0 );
  assert( pLoop->wsFlags & WHERE_BLOOMFILTER );
  assert( (pLoop->wsFlags & WHERE_IDX_ONLY)==0 );

  addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  do{
    const SrcList *pTabList;
    const SrcItem *pItem;
    const Table *pTab;
    u64 sz;
    int iSrc;
    sqlite3WhereExplainBloomFilter(pParse, pWInfo, pLevel);
    addrCont = sqlite3VdbeMakeLabel(pParse);
    iCur = pLevel->iTabCur;
    pLevel->regFilter = ++pParse->nMem;

    /* The Bloom filter is a Blob held in a register.  Initialize it
    ** to zero-filled blob of at least 80K bits, but maybe more if the
    ** estimated size of the table is larger.  We could actually
    ** measure the size of the table at run-time using OP_Count with
    ** P3==1 and use that value to initialize the blob.  But that makes
    ** testing complicated.  By basing the blob size on the value in the
    ** sqlite_stat1 table, testing is much easier.
    */
    pTabList = pWInfo->pTabList;
    iSrc = pLevel->iFrom;
    pItem = &pTabList->a[iSrc];
    assert( pItem!=0 );
    pTab = pItem->pSTab;
    assert( pTab!=0 );
    sz = sqlite3LogEstToInt(pTab->nRowLogEst);
    if( sz<10000 ){
      sz = 10000;
    }else if( sz>10000000 ){
      sz = 10000000;
    }
    sqlite3VdbeAddOp2(v, OP_Blob, (int)sz, pLevel->regFilter);

    addrTop = sqlite3VdbeAddOp1(v, OP_Rewind, iCur); VdbeCoverage(v);
    pWCEnd = &pWInfo->sWC.a[pWInfo->sWC.nTerm];
    for(pTerm=pWInfo->sWC.a; pTerm<pWCEnd; pTerm++){
      Expr *pExpr = pTerm->pExpr;
      if( (pTerm->wtFlags & TERM_VIRTUAL)==0
       && sqlite3ExprIsSingleTableConstraint(pExpr, pTabList, iSrc, 0)
      ){
        sqlite3ExprIfFalse(pParse, pTerm->pExpr, addrCont, SQLITE_JUMPIFNULL);
      }
    }
    if( pLoop->wsFlags & WHERE_IPK ){
      int r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(v, OP_Rowid, iCur, r1);
      sqlite3VdbeAddOp4Int(v, OP_FilterAdd, pLevel->regFilter, 0, r1, 1);
      sqlite3ReleaseTempReg(pParse, r1);
    }else{
      Index *pIdx = pLoop->u.btree.pIndex;
      int n = pLoop->u.btree.nEq;
      int r1 = sqlite3GetTempRange(pParse, n);
      int jj;
      for(jj=0; jj<n; jj++){
        assert( pIdx->pTable==pItem->pSTab );
        sqlite3ExprCodeLoadIndexColumn(pParse, pIdx, iCur, jj, r1+jj);
      }
      sqlite3VdbeAddOp4Int(v, OP_FilterAdd, pLevel->regFilter, 0, r1, n);
      sqlite3ReleaseTempRange(pParse, r1, n);
    }
    sqlite3VdbeResolveLabel(v, addrCont);
    sqlite3VdbeAddOp2(v, OP_Next, pLevel->iTabCur, addrTop+1);
    VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addrTop);
    pLoop->wsFlags &= ~WHERE_BLOOMFILTER;
    if( OptimizationDisabled(pParse->db, SQLITE_BloomPulldown) ) break;
    while( ++iLevel < pWInfo->nLevel ){
      const SrcItem *pTabItem;
      pLevel = &pWInfo->a[iLevel];
      pTabItem = &pWInfo->pTabList->a[pLevel->iFrom];
      if( pTabItem->fg.jointype & (JT_LEFT|JT_LTORJ) ) continue;
      pLoop = pLevel->pWLoop;
      if( NEVER(pLoop==0) ) continue;
      if( pLoop->prereq & notReady ) continue;
      if( (pLoop->wsFlags & (WHERE_BLOOMFILTER|WHERE_COLUMN_IN))
                 ==WHERE_BLOOMFILTER
      ){
        /* This is a candidate for bloom-filter pull-down (early evaluation).
        ** The test that WHERE_COLUMN_IN is omitted is important, as we are
        ** not able to do early evaluation of bloom filters that make use of
        ** the IN operator */
        break;
      }
    }
  }while( iLevel < pWInfo->nLevel );
  sqlite3VdbeJumpHere(v, addrOnce);
  pParse->pIdxEpr = saved_pIdxEpr;
  pParse->pIdxPartExpr = saved_pIdxPartExpr;
}